

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CMU462::Collada::ColladaWriter::writeMesh(ofstream *out,Mesh *mesh,int id)

{
  bool bVar1;
  HalfedgeMesh *this;
  Size SVar2;
  Size SVar3;
  Index IVar4;
  ostream *poVar5;
  void *this_00;
  pointer pFVar6;
  HalfedgeIter *pHVar7;
  pointer pHVar8;
  VertexIter *this_01;
  pointer pVVar9;
  _List_iterator<CMU462::Halfedge> local_b0;
  HalfedgeIter h;
  _Self local_a0;
  FaceIter f_1;
  _Self local_90;
  _Self local_88;
  FaceIter f;
  undefined1 local_78 [8];
  Vector3D p;
  _Self local_58;
  VertexIter v_1;
  _Self local_48;
  _Self local_40;
  VertexIter v;
  int index;
  int nF;
  int nV;
  HalfedgeMesh *m;
  int id_local;
  Mesh *mesh_local;
  ofstream *out_local;
  
  this = &mesh->mesh;
  SVar2 = HalfedgeMesh::nVertices(this);
  SVar3 = HalfedgeMesh::nFaces(this);
  v._M_node._4_4_ = 0;
  local_40._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(this);
  while( true ) {
    local_48._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(this);
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    IVar4 = (Index)v._M_node._4_4_;
    pVVar9 = std::_List_iterator<CMU462::Vertex>::operator->(&local_40);
    pVVar9->index = IVar4;
    v._M_node._4_4_ = v._M_node._4_4_ + 1;
    v_1._M_node = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(&local_40,0);
  }
  poVar5 = std::operator<<((ostream *)out,"      <geometry id=\"M");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,id);
  poVar5 = std::operator<<(poVar5,"\" name=\"Mesh");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,id);
  poVar5 = std::operator<<(poVar5,"\">");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"         <mesh>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"            <source id=\"M");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,id);
  poVar5 = std::operator<<(poVar5,"-positions\">");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"               <float_array id=\"M");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,id);
  poVar5 = std::operator<<(poVar5,"-positions-array\" count=\"");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)SVar2 * 3);
  poVar5 = std::operator<<(poVar5,"\">");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_58._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(this);
  while( true ) {
    p.z = (double)HalfedgeMesh::verticesEnd(this);
    bVar1 = std::operator!=(&local_58,(_Self *)&p.z);
    if (!bVar1) break;
    pVVar9 = std::_List_iterator<CMU462::Vertex>::operator->(&local_58);
    Vector3D::Vector3D((Vector3D *)local_78,&pVVar9->position);
    std::operator<<((ostream *)out,"                  ");
    poVar5 = (ostream *)std::ostream::operator<<(out,(double)local_78);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,p.x);
    poVar5 = std::operator<<(poVar5," ");
    this_00 = (void *)std::ostream::operator<<(poVar5,p.y);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    f._M_node = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(&local_58,0);
  }
  poVar5 = std::operator<<((ostream *)out,"               </float_array>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"               <technique_common>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"                  <accessor source=\"#M");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,id);
  poVar5 = std::operator<<(poVar5,"-positions-array\" count=\"");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)SVar2);
  poVar5 = std::operator<<(poVar5,"\" stride=\"3\">");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"                     <param name=\"X\" type=\"float\"/>")
  ;
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"                     <param name=\"Y\" type=\"float\"/>")
  ;
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"                     <param name=\"Z\" type=\"float\"/>")
  ;
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"                  </accessor>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"               </technique_common>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"            </source>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"            <vertices id=\"M");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,id);
  poVar5 = std::operator<<(poVar5,"-vertices\">");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"               <input semantic=\"POSITION\" source=\"#M")
  ;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,id);
  poVar5 = std::operator<<(poVar5,"-positions\"/>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"            </vertices>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"         <polylist count=\"");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)SVar3);
  poVar5 = std::operator<<(poVar5,"\">");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"            <input semantic=\"VERTEX\" source=\"#M");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,id);
  poVar5 = std::operator<<(poVar5,"-vertices\" offset=\"0\"/>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)out,"            <vcount>");
  local_88._M_node = (_List_node_base *)HalfedgeMesh::facesBegin(this);
  while( true ) {
    local_90._M_node = (_List_node_base *)HalfedgeMesh::facesEnd(this);
    bVar1 = std::operator!=(&local_88,&local_90);
    if (!bVar1) break;
    pFVar6 = std::_List_iterator<CMU462::Face>::operator->(&local_88);
    SVar2 = Face::degree(pFVar6);
    poVar5 = (ostream *)std::ostream::operator<<(out,SVar2);
    std::operator<<(poVar5," ");
    f_1._M_node = (_List_node_base *)std::_List_iterator<CMU462::Face>::operator++(&local_88,0);
  }
  poVar5 = std::operator<<((ostream *)out,"            </vcount>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"            <p>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_a0._M_node = (_List_node_base *)HalfedgeMesh::facesBegin(this);
  while( true ) {
    h._M_node = (_List_node_base *)HalfedgeMesh::facesEnd(this);
    bVar1 = std::operator!=(&local_a0,(_Self *)&h);
    if (!bVar1) break;
    std::operator<<((ostream *)out,"               ");
    pFVar6 = std::_List_iterator<CMU462::Face>::operator->(&local_a0);
    pHVar7 = Face::halfedge(pFVar6);
    local_b0._M_node = pHVar7->_M_node;
    do {
      pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_b0);
      this_01 = Halfedge::vertex(pHVar8);
      pVVar9 = std::_List_iterator<CMU462::Vertex>::operator->(this_01);
      poVar5 = (ostream *)std::ostream::operator<<(out,pVVar9->index);
      std::operator<<(poVar5," ");
      pHVar8 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_b0);
      pHVar7 = Halfedge::next(pHVar8);
      local_b0._M_node = pHVar7->_M_node;
      pFVar6 = std::_List_iterator<CMU462::Face>::operator->(&local_a0);
      pHVar7 = Face::halfedge(pFVar6);
      bVar1 = std::operator!=(&local_b0,pHVar7);
    } while (bVar1);
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    std::_List_iterator<CMU462::Face>::operator++(&local_a0,0);
  }
  poVar5 = std::operator<<((ostream *)out,"            </p>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"         </polylist>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"         </mesh>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)out,"      </geometry>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ColladaWriter::writeMesh( ofstream& out, DynamicScene::Mesh* mesh, int id )
{
   HalfedgeMesh& m( mesh->mesh );
   int nV = m.nVertices();
   int nF = m.nFaces();

   // TODO transformations are currently ignored

   // assign a unique ID to each vertex (we will need these so that
   // each polygon can reference its vertices)
   int index = 0;
   for( VertexIter v = m.verticesBegin(); v != m.verticesEnd(); v++ )
   {
      v->index = index;
      index++;
   }

   out << "      <geometry id=\"M" << id << "\" name=\"Mesh" << id << "\">" << endl;
   out << "         <mesh>" << endl;

   // positions -------------
   out << "            <source id=\"M" << id << "-positions\">" << endl;
   out << "               <float_array id=\"M" << id << "-positions-array\" count=\"" << 3*nV << "\">" << endl;
   for( VertexIter v = m.verticesBegin(); v != m.verticesEnd(); v++ )
   {
      Vector3D p = v->position;
      out << "                  ";
      out << p.x << " " << p.y << " " << p.z << endl;
   }
   out << "               </float_array>" << endl;
   out << "               <technique_common>" << endl;
   out << "                  <accessor source=\"#M" << id << "-positions-array\" count=\"" << nV << "\" stride=\"3\">" << endl;
   out << "                     <param name=\"X\" type=\"float\"/>" << endl;
   out << "                     <param name=\"Y\" type=\"float\"/>" << endl;
   out << "                     <param name=\"Z\" type=\"float\"/>" << endl;
   out << "                  </accessor>" << endl;
   out << "               </technique_common>" << endl;
   out << "            </source>" << endl;
   
   // vertices -------------
   out << "            <vertices id=\"M" << id << "-vertices\">" << endl;
   out << "               <input semantic=\"POSITION\" source=\"#M" << id << "-positions\"/>" << endl;
   out << "            </vertices>" << endl;
   
   // polygons -------------
   out << "         <polylist count=\"" << nF << "\">" << endl;
   out << "            <input semantic=\"VERTEX\" source=\"#M" << id << "-vertices\" offset=\"0\"/>" << endl;
   out << "            <vcount>";
   for( FaceIter f = m.facesBegin(); f != m.facesEnd(); f++ )
   {
      out << f->degree() << " ";
   }
   out << "            </vcount>" << endl;
   out << "            <p>" << endl;
   for( FaceIter f = m.facesBegin(); f != m.facesEnd(); f++ )
   {
      out << "               ";
      HalfedgeIter h = f->halfedge();
      do
      {
         out << h->vertex()->index << " ";
         h = h->next();
      }
      while( h != f->halfedge() );
      out << endl;
   }
   out << "            </p>" << endl;
   out << "         </polylist>" << endl;

   out << "         </mesh>" << endl;
   out << "      </geometry>" << endl;
}